

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::taylor_inplace_multiplier<double,_1,_8,_10,_0>::mul(double *p1,double *p2)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  double *pdVar5;
  double dVar6;
  
  dVar6 = *p2 * p1[8];
  p1[8] = dVar6;
  lVar4 = 0x40;
  pdVar5 = p1;
  do {
    dVar6 = dVar6 + *pdVar5 * *(double *)((long)p2 + lVar4);
    p1[8] = dVar6;
    pdVar5 = pdVar5 + 1;
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  dVar6 = *p2 * p1[7];
  p1[7] = dVar6;
  lVar4 = 0x38;
  pdVar5 = p1;
  do {
    dVar6 = dVar6 + *pdVar5 * *(double *)((long)p2 + lVar4);
    p1[7] = dVar6;
    pdVar5 = pdVar5 + 1;
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  dVar6 = *p2 * p1[6];
  p1[6] = dVar6;
  lVar4 = 0x30;
  pdVar5 = p1;
  do {
    dVar6 = dVar6 + *pdVar5 * *(double *)((long)p2 + lVar4);
    p1[6] = dVar6;
    pdVar5 = pdVar5 + 1;
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  dVar6 = *p2 * p1[5];
  p1[5] = dVar6;
  lVar4 = 0x28;
  pdVar5 = p1;
  do {
    dVar6 = dVar6 + *pdVar5 * *(double *)((long)p2 + lVar4);
    p1[5] = dVar6;
    pdVar5 = pdVar5 + 1;
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  dVar6 = *p2 * p1[4];
  p1[4] = dVar6;
  lVar4 = 0x20;
  pdVar5 = p1;
  do {
    dVar6 = dVar6 + *pdVar5 * *(double *)((long)p2 + lVar4);
    p1[4] = dVar6;
    pdVar5 = pdVar5 + 1;
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  dVar6 = *p2 * p1[3];
  p1[3] = dVar6;
  lVar4 = 0x18;
  pdVar5 = p1;
  do {
    dVar6 = dVar6 + *pdVar5 * *(double *)((long)p2 + lVar4);
    p1[3] = dVar6;
    pdVar5 = pdVar5 + 1;
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  dVar6 = *p2 * p1[2];
  p1[2] = dVar6;
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    dVar6 = dVar6 + p1[lVar4] * *(double *)((long)p2 + (ulong)(uint)((2 - (int)lVar4) * 8));
    p1[2] = dVar6;
    lVar4 = 1;
    bVar2 = false;
  } while (bVar3);
  dVar6 = *p2;
  dVar1 = p1[1];
  p1[1] = dVar6 * dVar1;
  p1[1] = p2[1] * *p1 + dVar6 * dVar1;
  *p1 = *p1 * *p2;
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    p1[Ndeg] *= p2[0];
    if (Ndeg <= Ndeg2) {
      for (int i = 0; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    } else {
      for (int i = Ndeg - Ndeg2; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    }
    taylor_inplace_multiplier<numtype, 1, Ndeg - 1, Ndeg2, 0>::mul(p1, p2);
  }